

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AppendFortranPreprocessFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source,
          PreprocessFlagsRequired requires_pp)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *this_02;
  char *__s;
  string *psVar1;
  undefined1 auVar2 [16];
  string_view value;
  string_view value_00;
  allocator<char> local_f9;
  string local_f8;
  char *local_d8;
  char *var;
  char *local_c8;
  allocator<char> local_b9;
  string local_b8;
  string *local_98;
  string *tgtpp;
  char *local_88;
  FortranPreprocess local_80;
  FortranPreprocess preprocess;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string srcpp;
  PreprocessFlagsRequired requires_pp_local;
  cmSourceFile *source_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  srcpp.field_2._12_4_ = requires_pp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Fortran_PREPROCESS",&local_69);
  psVar1 = cmSourceFile::GetSafeProperty(source,&local_68);
  std::__cxx11::string::string(local_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  value._M_str = auVar2._8_8_;
  tgtpp = auVar2._0_8_;
  value._M_len = (size_t)value._M_str;
  local_88 = value._M_str;
  local_80 = cmOutputConverter::GetFortranPreprocess((cmOutputConverter *)tgtpp,value);
  if (local_80 == Unset) {
    this_00 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Fortran_PREPROCESS",&local_b9);
    psVar1 = cmGeneratorTarget::GetSafeProperty(this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    local_98 = psVar1;
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1);
    value_00._M_str = auVar2._8_8_;
    var = auVar2._0_8_;
    value_00._M_len = (size_t)value_00._M_str;
    local_c8 = value_00._M_str;
    local_80 = cmOutputConverter::GetFortranPreprocess((cmOutputConverter *)var,value_00);
  }
  local_d8 = (char *)0x0;
  if (local_80 == NotNeeded) {
    local_d8 = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
  }
  else if ((local_80 == Needed) && (srcpp.field_2._12_4_ == 0)) {
    local_d8 = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
  }
  __s = local_d8;
  if (local_d8 != (char *)0x0) {
    this_01 = this->Makefile;
    this_02 = this->LocalCommonGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,__s,&local_f9);
    psVar1 = cmMakefile::GetSafeDefinition(this_01,&local_f8);
    cmLocalGenerator::AppendCompileOptions
              (&this_02->super_cmLocalGenerator,flags,psVar1,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranPreprocessFlags(
  std::string& flags, cmSourceFile const& source,
  PreprocessFlagsRequired requires_pp)
{
  const std::string srcpp = source.GetSafeProperty("Fortran_PREPROCESS");
  cmOutputConverter::FortranPreprocess preprocess =
    cmOutputConverter::GetFortranPreprocess(srcpp);
  if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
    std::string const& tgtpp =
      this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
    preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
  }
  const char* var = nullptr;
  switch (preprocess) {
    case cmOutputConverter::FortranPreprocess::Needed:
      if (requires_pp == PreprocessFlagsRequired::YES) {
        var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
      }
      break;
    case cmOutputConverter::FortranPreprocess::NotNeeded:
      var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendCompileOptions(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}